

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv_clock_gettime(uv_clock_id clock_id,uv_timespec64_t *ts)

{
  int iVar1;
  int *piVar2;
  clockid_t __clock_id;
  timespec t;
  timespec local_18;
  
  if (ts == (uv_timespec64_t *)0x0) {
    return -0xe;
  }
  if (clock_id == UV_CLOCK_MONOTONIC) {
    __clock_id = 1;
  }
  else {
    if (clock_id != UV_CLOCK_REALTIME) {
      return -0x16;
    }
    __clock_id = 0;
  }
  iVar1 = clock_gettime(__clock_id,&local_18);
  if (iVar1 == 0) {
    ts->tv_sec = local_18.tv_sec;
    ts->tv_nsec = (int32_t)local_18.tv_nsec;
    iVar1 = 0;
  }
  else {
    piVar2 = __errno_location();
    iVar1 = -*piVar2;
  }
  return iVar1;
}

Assistant:

int uv_clock_gettime(uv_clock_id clock_id, uv_timespec64_t* ts) {
  struct timespec t;
  int r;

  if (ts == NULL)
    return UV_EFAULT;

  switch (clock_id) {
    default:
      return UV_EINVAL;
    case UV_CLOCK_MONOTONIC:
      r = clock_gettime(CLOCK_MONOTONIC, &t);
      break;
    case UV_CLOCK_REALTIME:
      r = clock_gettime(CLOCK_REALTIME, &t);
      break;
  }

  if (r)
    return UV__ERR(errno);

  ts->tv_sec = t.tv_sec;
  ts->tv_nsec = t.tv_nsec;

  return 0;
}